

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O0

int ShrinkLoop(uchar *out,uint outsize,FileReader *In,uint InLeft)

{
  uchar *puVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  byte local_8163;
  byte local_8162;
  byte local_8161;
  uint local_8160;
  uchar next_2;
  uchar next_1;
  uint uStack_815c;
  uchar next;
  uint be;
  uint bs;
  uint size;
  uint Hold;
  uint Bits;
  int curcode;
  int freecode;
  int oldcode;
  int code;
  int codesize;
  int KwKwK;
  int len;
  uchar *newstr;
  uchar Stack [8192];
  uchar Value [8192];
  unsigned_short Parent [8192];
  uchar ReadBuf [256];
  uint InLeft_local;
  FileReader *In_local;
  uint outsize_local;
  uchar *out_local;
  
  oldcode = 9;
  size = 0;
  bs = 0;
  uStack_815c = 0;
  local_8160 = 0;
  Bits = 0x100;
  for (freecode = 0; freecode < 0x100; freecode = freecode + 1) {
    Stack[(long)freecode + 0x1ff8] = (uchar)freecode;
    Parent[(long)freecode + -4] = 0x100;
  }
  for (freecode = 0x101; ReadBuf._252_4_ = InLeft, freecode < 0x2000; freecode = freecode + 1) {
    Parent[(long)freecode + -4] = 0x2000;
  }
  for (; size < 9; size = size + 8) {
    local_8161 = 0;
    if (ReadBuf._252_4_ != 0) {
      ReadBuf._252_4_ = ReadBuf._252_4_ + -1;
      if (uStack_815c < local_8160) {
        local_8161 = *(byte *)((long)Parent + (ulong)uStack_815c + 0x3ff8);
        uStack_815c = uStack_815c + 1;
      }
      else {
        local_8160 = (*(In->super_FileReaderBase)._vptr_FileReaderBase[2])(In,Parent + 0x1ffc,0x100)
        ;
        local_8161 = (byte)Parent[0x1ffc];
        uStack_815c = 1;
      }
    }
    bs = ((uint)local_8161 << ((byte)size & 0x1f)) + bs;
  }
  curcode = bs & 0x1ff;
  bs = bs >> 9;
  size = size - 9;
  if (outsize != 0) {
    *out = (uchar)curcode;
  }
  be = (uint)(outsize != 0);
  while (be < outsize) {
    for (; size < (uint)oldcode; size = size + 8) {
      local_8162 = 0;
      if (ReadBuf._252_4_ != 0) {
        ReadBuf._252_4_ = ReadBuf._252_4_ + -1;
        if (uStack_815c < local_8160) {
          local_8162 = *(byte *)((long)Parent + (ulong)uStack_815c + 0x3ff8);
          uStack_815c = uStack_815c + 1;
        }
        else {
          local_8160 = (*(In->super_FileReaderBase)._vptr_FileReaderBase[2])
                                 (In,Parent + 0x1ffc,0x100);
          local_8162 = (byte)Parent[0x1ffc];
          uStack_815c = 1;
        }
      }
      bs = ((uint)local_8162 << ((byte)size & 0x1f)) + bs;
    }
    bVar3 = (byte)oldcode;
    uVar2 = bs & (1 << (bVar3 & 0x1f)) - 1U;
    bs = bs >> (bVar3 & 0x1f);
    size = size - oldcode;
    if (uVar2 == 0x100) {
      for (; size < (uint)oldcode; size = size + 8) {
        local_8163 = 0;
        if (ReadBuf._252_4_ != 0) {
          ReadBuf._252_4_ = ReadBuf._252_4_ + -1;
          if (uStack_815c < local_8160) {
            local_8163 = *(byte *)((long)Parent + (ulong)uStack_815c + 0x3ff8);
            uStack_815c = uStack_815c + 1;
          }
          else {
            local_8160 = (*(In->super_FileReaderBase)._vptr_FileReaderBase[2])
                                   (In,Parent + 0x1ffc,0x100);
            local_8163 = (byte)Parent[0x1ffc];
            uStack_815c = 1;
          }
        }
        bs = ((uint)local_8163 << ((byte)size & 0x1f)) + bs;
      }
      uVar2 = bs & (1 << (bVar3 & 0x1f)) - 1U;
      bs = bs >> (bVar3 & 0x1f);
      size = size - oldcode;
      if (uVar2 == 1) {
        oldcode = oldcode + 1;
      }
      else if (uVar2 == 2) {
        for (freecode = 0x101; freecode < 0x2000; freecode = freecode + 1) {
          uVar2 = Parent[(long)freecode + -4] & 0x1fff;
          if (0x100 < uVar2) {
            Parent[(long)(int)uVar2 + -4] = Parent[(long)(int)uVar2 + -4] | 0x4000;
          }
        }
        for (freecode = 0x101; freecode < 0x2000; freecode = freecode + 1) {
          if ((Parent[(long)freecode + -4] & 0x4000) == 0) {
            Parent[(long)freecode + -4] = 0x2000;
          }
          else {
            Parent[(long)freecode + -4] = Parent[(long)freecode + -4] & 0xbfff;
          }
        }
        Bits = 0x100;
      }
    }
    else {
      _KwKwK = Stack + 0x1ff7;
      bVar4 = Parent[(long)(int)uVar2 + -4] == 0x2000;
      Hold = uVar2;
      if (bVar4) {
        _KwKwK = Stack + 0x1ff6;
        Hold = curcode;
      }
      codesize = (int)bVar4;
      puVar1 = _KwKwK;
      do {
        _KwKwK = puVar1;
        *_KwKwK = Stack[(long)(int)Hold + 0x1ff8];
        codesize = codesize + 1;
        Hold = Parent[(long)(int)Hold + -4] & 0x1fff;
        puVar1 = _KwKwK + -1;
      } while (Hold != 0x100);
      if (bVar4) {
        Stack[0x1ff7] = *_KwKwK;
      }
      do {
        Bits = Bits + 1;
      } while (Parent[(long)(int)Bits + -4] != 0x2000);
      Parent[(long)(int)Bits + -4] = (unsigned_short)curcode;
      Stack[(long)(int)Bits + 0x1ff8] = *_KwKwK;
      while (curcode = uVar2, codesize != 0) {
        out[be] = *_KwKwK;
        be = be + 1;
        codesize = codesize + -1;
        _KwKwK = _KwKwK + 1;
      }
    }
  }
  return 0;
}

Assistant:

int ShrinkLoop(unsigned char *out, unsigned int outsize,
			   FileReader *In, unsigned int InLeft)
{
	unsigned char ReadBuf[256];
	unsigned short Parent[HSIZE];
	unsigned char Value[HSIZE], Stack[HSIZE];
	unsigned char *newstr;
	int len;
	int KwKwK, codesize = 9;	/* start at 9 bits/code */
	int code, oldcode, freecode, curcode;
	unsigned int Bits = 0, Hold = 0;
	unsigned int size = 0;
	unsigned int bs = 0, be = 0;

	freecode = BOGUSCODE;
	for (code = 0; code < BOGUSCODE; code++)
	{
		Value[code] = code;
		Parent[code] = BOGUSCODE;
	}
	for (code = BOGUSCODE+1; code < HSIZE; code++)
		Parent[code] = FREE_CODE;

	READBITS(oldcode, codesize);
	if (size < outsize) {
		out[size++] = oldcode;
	}

	while (size < outsize)
	{
		READBITS(code, codesize);
		if (code == BOGUSCODE) {	/* possible to have consecutive escapes? */
			READBITS(code, codesize);
			if (code == 1) {
				codesize++;
			} else if (code == 2) {
				/* clear leafs (nodes with no children) */
				/* first loop:  mark each parent as such */
				for (code = BOGUSCODE+1;  code < HSIZE;  ++code) {
					curcode = (Parent[code] & CODE_MASK);

					if (curcode > BOGUSCODE)
						Parent[curcode] |= HAS_CHILD;		/* set parent's child-bit */
				}

				/* second loop:  clear all nodes *not* marked as parents; reset flag bits */
				for (code = BOGUSCODE+1;  code < HSIZE;  ++code) {
					if (Parent[code] & HAS_CHILD) {		/* just clear child-bit */
						Parent[code] &= ~HAS_CHILD;
					} else {							/* leaf:  lose it */
						Parent[code] = FREE_CODE;
					}
				}
				freecode = BOGUSCODE;
			}
			continue;
		}

		newstr = &Stack[HSIZE-1];
		curcode = code;

		if (Parent[curcode] == FREE_CODE) {
			KwKwK = 1;
			newstr--;	/* last character will be same as first character */
			curcode = oldcode;
			len = 1;
		} else {
			KwKwK = 0;
			len = 0;
		}

		do {
			*newstr-- = Value[curcode];
			len++;
			curcode = (Parent[curcode] & CODE_MASK);
		} while (curcode != BOGUSCODE);

		newstr++;
		if (KwKwK) {
			Stack[HSIZE-1] = *newstr;
		}

		do {
			freecode++;
		} while (Parent[freecode] != FREE_CODE);

		Parent[freecode] = oldcode;
		Value[freecode] = *newstr;
		oldcode = code;

		while (len--) {
			out[size++] = *newstr++;
		}
	}
	return 0;
}